

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReaderMgr.cpp
# Opt level: O1

XMLCh __thiscall xercesc_4_0::ReaderMgr::skipUntilInOrWS(ReaderMgr *this,XMLCh *listToSkip)

{
  XMLCh ch;
  int iVar1;
  
  while ((ch = peekNextChar(this), ch != L'\0' &&
         (-1 < (char)this->fCurReader->fgCharCharsTable[(ushort)ch]))) {
    iVar1 = XMLString::indexOf(listToSkip,ch);
    if (iVar1 != -1) {
      return ch;
    }
    getNextChar(this);
  }
  return ch;
}

Assistant:

XMLCh ReaderMgr::skipUntilInOrWS(const XMLCh* const listToSkip)
{
    XMLCh nextCh;
    // If we get an end of file char, then return
    while ((nextCh = peekNextChar())!=0)
    {
        if (fCurReader->isWhitespace(nextCh))
            break;

        if (XMLString::indexOf(listToSkip, nextCh) != -1)
            break;

        // Its one of ours, so eat it
        getNextChar();
    }
    return nextCh;
}